

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase238::run(TestCase238 *this)

{
  Reader reader_00;
  Builder builder_00;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  ArrayPtr<capnp::word> scratchSpace;
  Array<capnp::word> serialized;
  TestInputStream stream;
  InputStreamMessageReader reader;
  TestMessageBuilder builder;
  word scratch [4096];
  Array<capnp::word> local_82f8;
  StructBuilder local_82e0;
  InputStream local_82b8;
  word *local_82b0;
  word *local_82a8;
  undefined1 local_82a0;
  Reader local_8298;
  StructReader local_8278;
  SegmentReader *local_8248;
  CapTableReader *pCStack_8240;
  WirePointer *local_8238;
  undefined8 in_stack_ffffffffffff7dd0;
  SegmentBuilder *in_stack_ffffffffffff7dd8;
  CapTableBuilder *in_stack_ffffffffffff7de0;
  WirePointer *in_stack_ffffffffffff7de8;
  void *in_stack_ffffffffffff7df0;
  TestMessageBuilder local_8100;
  PointerBuilder local_8008 [1365];
  
  MallocMessageBuilder::MallocMessageBuilder(&local_8100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_8100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_003788a0;
  local_8100.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&stack0xffffffffffff7dd8,(MessageBuilder *)&local_8100)
  ;
  PointerBuilder::initStruct(&local_82e0,local_8008,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_ffffffffffff7dd8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_ffffffffffff7dd0;
  builder_00._builder.data = in_stack_ffffffffffff7de0;
  builder_00._builder.pointers = in_stack_ffffffffffff7de8;
  builder_00._builder._32_8_ = in_stack_ffffffffffff7df0;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_8100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_82f8,(capnp *)AVar3.ptr,segments);
  local_82b8._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00378970;
  local_82b0 = local_82f8.ptr;
  local_82a8 = local_82f8.ptr + local_82f8.size_;
  local_82a0 = 0;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  scratchSpace.size_ = 0x1000;
  scratchSpace.ptr = (word *)local_8008;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xffffffffffff7dd8,&local_82b8,options,scratchSpace);
  MessageReader::getRootInternal(&local_8298,(MessageReader *)&stack0xffffffffffff7dd8);
  local_8238 = local_8298.reader.pointer;
  local_8248 = local_8298.reader.segment;
  pCStack_8240 = local_8298.reader.capTable;
  PointerReader::getStruct(&local_8278,(PointerReader *)&local_8248,(word *)0x0);
  reader_00._reader.capTable = local_8278.capTable;
  reader_00._reader.segment = local_8278.segment;
  reader_00._reader.data = local_8278.data;
  reader_00._reader.pointers = local_8278.pointers;
  reader_00._reader.dataSize = local_8278.dataSize;
  reader_00._reader.pointerCount = local_8278.pointerCount;
  reader_00._reader._38_2_ = local_8278._38_2_;
  reader_00._reader.nestingLimit = local_8278.nestingLimit;
  reader_00._reader._44_4_ = local_8278._44_4_;
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xffffffffffff7dd8);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_82b8);
  sVar2 = local_82f8.size_;
  pwVar1 = local_82f8.ptr;
  if (local_82f8.ptr != (word *)0x0) {
    local_82f8.ptr = (word *)0x0;
    local_82f8.size_ = 0;
    (*(code *)**(undefined8 **)local_82f8.disposer)(local_82f8.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder(&local_8100);
  return;
}

Assistant:

TEST(Orphans, OrphanageStructCopy) {
  MallocMessageBuilder builder1;
  MallocMessageBuilder builder2;

  auto root1 = builder1.initRoot<TestAllTypes>();
  initTestMessage(root1);

  Orphan<TestAllTypes> orphan = builder2.getOrphanage().newOrphanCopy(root1.asReader());
  checkTestMessage(orphan.getReader());

  auto root2 = builder2.initRoot<TestAllTypes>();
  root2.adoptStructField(kj::mv(orphan));
}